

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

void rw::gl3::writeNativeTexture(Texture *tex,Stream *stream)

{
  char cVar1;
  byte bVar2;
  Raster *this;
  uint uVar3;
  uint32 uVar4;
  uint8 *puVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  long lVar7;
  uint level;
  
  this = tex->raster;
  lVar7 = (long)nativeRasterOffset;
  uVar4 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar4 - 0xc);
  Stream::writeU32(stream,0xc);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  cVar1 = *(char *)((long)&this->width + lVar7 + 3);
  Stream::writeI32(stream,this->format);
  Stream::writeI32(stream,this->width);
  Stream::writeI32(stream,this->height);
  Stream::writeI32(stream,this->depth);
  Stream::writeI32(stream,(int)cVar1);
  bVar2 = *(byte *)((long)&this->width + lVar7 + 1);
  uVar3 = bVar2 + 2;
  if (*(char *)((long)&this->width + lVar7) == '\0') {
    uVar3 = (uint)bVar2;
  }
  Stream::writeI32(stream,gl3Caps);
  Stream::writeI32(stream,uVar3);
  level = 0;
  Stream::writeI32(stream,0);
  uVar6 = extraout_RDX;
  uVar3 = (int)cVar1;
  if (cVar1 < '\x01') {
    uVar3 = level;
  }
  for (; uVar3 != level; level = level + 1) {
    uVar4 = getLevelSize((gl3 *)this,(Raster *)(ulong)level,(int32)uVar6);
    Stream::writeU32(stream,uVar4);
    puVar5 = Raster::lock(this,level,2);
    (*stream->_vptr_Stream[3])(stream,puVar5,(ulong)uVar4);
    Raster::unlock(this,level);
    uVar6 = extraout_RDX_00;
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	Raster *raster = tex->raster;
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_GL3);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	int32 numLevels = natras->numLevels;
	stream->writeI32(raster->format);
	stream->writeI32(raster->width);
	stream->writeI32(raster->height);
	stream->writeI32(raster->depth);
	stream->writeI32(numLevels);

	// Native raster
	int32 flags = 0;
	int32 compression = 0;
	if(natras->hasAlpha)
		flags |= 1;
	if(natras->isCompressed){
		flags |= 2;
		switch(natras->internalFormat){
#ifdef RW_OPENGL
		case GL_COMPRESSED_RGBA_S3TC_DXT1_EXT:
		case GL_COMPRESSED_RGB_S3TC_DXT1_EXT:
			compression = 1;
			break;
		case GL_COMPRESSED_RGBA_S3TC_DXT3_EXT:
			compression = 3;
			break;
		case GL_COMPRESSED_RGBA_S3TC_DXT5_EXT:
			compression = 5;
			break;
#endif
		default:
			assert(0 && "unknown compression");
		}
	}
	stream->writeI32(gl3Caps.gles);
	stream->writeI32(flags);
	stream->writeI32(compression);
	// TODO: auto mipmaps?

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = getLevelSize(raster, i);
		stream->writeU32(size);
		data = raster->lock(i, Raster::LOCKREAD);
		stream->write8(data, size);
		raster->unlock(i);
	}
}